

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execCmp<(moira::Instr)37,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 in_EAX;
  u32 data;
  u32 ea;
  
  data = in_EAX;
  bVar1 = readOp<(moira::Mode)3,(moira::Size)4,0ul>(this,opcode & 7,&ea,&data);
  if (bVar1) {
    cmp<(moira::Size)4>(this,data,*(u32 *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58))
    ;
    prefetch<4ul>(this);
    (*this->_vptr_Moira[0x19])(this,2);
  }
  return;
}

Assistant:

void
Moira::execCmp(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    cmp<S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
}